

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

size_t __thiscall kws::Parser::IsTemplated(Parser *this,string *buffer,size_t classnamepos)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  ulong in_RDX;
  char *in_RSI;
  size_t i_1;
  bool ok;
  uint n;
  size_t i;
  size_t pos;
  size_t p0;
  size_t returnval;
  size_t templatepos;
  ulong local_58;
  int local_4c;
  ulong local_48;
  ulong local_40;
  size_t local_30;
  ulong local_28;
  
  local_30 = std::__cxx11::string::find(in_RSI,0x1e58b0);
  local_28 = local_30;
  do {
    if (local_28 == 0xffffffffffffffff || in_RDX <= local_28) {
      return local_30;
    }
    local_48 = std::__cxx11::string::find(in_RSI,0x1e5c08);
    local_40 = 0xffffffffffffffff;
    if (local_48 != 0xffffffffffffffff) {
      local_4c = 1;
      do {
        local_48 = local_48 + 1;
        if (in_RDX <= local_48 || local_4c == 0) goto LAB_0013a901;
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
        if (*pcVar2 == '<') {
          local_4c = local_4c + 1;
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
          if (*pcVar2 == '>') {
            local_4c = local_4c + -1;
          }
        }
      } while (local_4c != 0);
      local_40 = local_48;
    }
LAB_0013a901:
    if ((local_40 < in_RDX) && (local_40 != 0xffffffffffffffff)) {
      bVar1 = true;
      while (local_58 = local_40 + 1, local_58 < in_RDX) {
        lVar3 = std::__cxx11::string::c_str();
        local_40 = local_58;
        if (((*(char *)(lVar3 + local_58) != '\r') &&
            (lVar3 = std::__cxx11::string::c_str(), *(char *)(lVar3 + local_58) != '\n')) &&
           (lVar3 = std::__cxx11::string::c_str(), *(char *)(lVar3 + local_58) != '\t')) {
          bVar1 = false;
        }
      }
      if (bVar1) {
        return local_28;
      }
    }
    local_30 = local_28;
    local_28 = std::__cxx11::string::find(in_RSI,0x1e58b0);
  } while( true );
}

Assistant:

size_t Parser::IsTemplated(const std::string & buffer, size_t classnamepos) const
{
  size_t templatepos = buffer.find("template",0);
  size_t returnval = templatepos;

  while(templatepos!=std::string::npos && templatepos<classnamepos)
    {
    // find the last > that corresponding to the template
    size_t p0 = buffer.find("<",templatepos);
    size_t pos = std::string::npos;
    if(p0!=std::string::npos)
      {
      size_t i=p0+1;
      unsigned int n=1;

      while(i<classnamepos && n>0)
        {
        if(buffer[i] == '<')
          {
          n++;
          }
        else if(buffer[i] == '>')
          {
          n--;
          }
        if(n==0)
          {
          pos =i;
          break;
          }
        i++;
        }
      }

    if(pos<classnamepos && pos!=std::string::npos)
      {
      bool ok = true;
      // Check if between the last > and classnamepos we don't have words
      for(size_t i=pos+1;i<classnamepos;i++)
        {
        if(buffer.c_str()[i] != 13 && buffer.c_str()[i] != '\n' && buffer.c_str()[i]!= '\t')
          {
          ok = false;
          }
        }
      if(ok)
        {
        return templatepos;
        }
      /*else
        {
        std::cout << "ERROR in Parser::IsTemplated, Cannot find proper template parameters" << std::endl;
        system("PAUSE");
        }*/
      }
    returnval = templatepos;
    templatepos = buffer.find("template",templatepos+1);
    }

  return returnval;
}